

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::TrackAddPropertyTypes(BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  PropertySym *pPVar9;
  AddPropertyCacheBucket *pAVar10;
  JITType *pJVar11;
  JITTypeHandler *pJVar12;
  JITTypeHandler *newTypeHandler;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *pHVar13;
  GlobOpt *oldTypeHandler;
  BackwardPass *this_00;
  JITTypeHolderBase<void> *pJVar14;
  JITTypeHolderBase<void> local_98;
  JITTypeHolderBase<void> local_90;
  JITTypeHolderBase<void> local_88;
  undefined1 local_80 [32];
  JITTypeHolderBase<void> local_60;
  JITTypeHolderBase<void> local_58;
  JITTypeHolder deadStoreUnavailableFinalType;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder typeWithoutProperty;
  JITTypeHolder finalType;
  JITTypeHolder checkFinalType;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1691,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase"
                      );
    if (!bVar3) goto LAB_003d33d7;
    *puVar8 = 0;
  }
  bVar3 = IR::PropertySymOpnd::IsMono(opnd);
  if ((!bVar3) && (bVar3 = IR::PropertySymOpnd::HasEquivalentTypeSet(opnd), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1692,"(opnd->IsMono() || opnd->HasEquivalentTypeSet())",
                       "opnd->IsMono() || opnd->HasEquivalentTypeSet()");
    if (!bVar3) goto LAB_003d33d7;
    *puVar8 = 0;
  }
  bVar3 = IR::PropertySymOpnd::IsMono(opnd);
  if (bVar3) {
    local_60.t = (Type)IR::PropertySymOpnd::GetType(opnd);
  }
  else {
    local_60.t = (Type)IR::PropertySymOpnd::GetFirstEquivalentType(opnd);
  }
  bVar3 = IR::PropertySymOpnd::HasInitialType(opnd);
  if (bVar3) {
    local_48.t = (Type)IR::PropertySymOpnd::GetInitialType(opnd);
  }
  else {
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_48,(JITType *)0x0);
  }
  typeWithoutProperty.t = (Type)0x0;
  bVar3 = JITTypeHolderBase<void>::operator==(&local_48,&typeWithoutProperty.t);
  if (((bVar3) || (bVar3 = JITTypeHolderBase<void>::operator==(&local_60,&local_48), bVar3)) ||
     ((((opnd->field_12).objTypeSpecFlags & 0x800) != 0 &&
      (((opnd->field_12).objTypeSpecFlags & 0x1000) == 0)))) {
    if (((this->currentPrePassLoop == (Loop *)0x0) &&
        (block->stackSymToFinalType !=
         (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0)) &&
       ((this->currentInstr->field_0x38 & 0x10) == 0)) {
      pPVar9 = Sym::AsPropertySym((opnd->super_SymOpnd).m_sym);
      pAVar10 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Get
                          (block->stackSymToFinalType,(pPVar9->m_stackSym->super_Sym).m_id);
      if (pAVar10 != (AddPropertyCacheBucket *)0x0) {
        typeWithoutProperty.t = (pAVar10->finalType).t;
        local_58.t = (Type)0x0;
        bVar3 = JITTypeHolderBase<void>::operator!=(&typeWithoutProperty,&local_58.t);
        if (bVar3) {
          finalType.t = (pAVar10->initialType).t;
          deadStoreUnavailableFinalType.t = (pAVar10->finalType).t;
          bVar3 = JITTypeHolderBase<void>::operator!=(&finalType,&deadStoreUnavailableFinalType);
          if (bVar3) {
            IR::PropertySymOpnd::SetFinalType(opnd,(pAVar10->finalType).t);
          }
        }
      }
    }
    return;
  }
  typeWithoutProperty.t = (Type)0x0;
  bVar3 = JITTypeHolderBase<void>::operator!=(&local_60,&typeWithoutProperty.t);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x16aa,"(typeWithProperty != nullptr)","typeWithProperty != nullptr");
    if (!bVar3) goto LAB_003d33d7;
    *puVar8 = 0;
  }
  local_80._16_8_ = block;
  pJVar11 = JITTypeHolderBase<void>::operator->(&local_48);
  pJVar12 = JITType::GetTypeHandler(pJVar11);
  pJVar11 = JITTypeHolderBase<void>::operator->(&local_60);
  newTypeHandler = JITType::GetTypeHandler(pJVar11);
  bVar3 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(pJVar12,newTypeHandler);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x16b0,
                       "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(typeWithoutPropertyTypeHandler, typeWithPropertyTypeHandler))"
                       ,"TypeHandlers are not compatible for transition?");
    if (!bVar3) goto LAB_003d33d7;
    *puVar8 = 0;
  }
  iVar4 = JITTypeHandler::GetSlotCapacity(pJVar12);
  iVar5 = JITTypeHandler::GetSlotCapacity(newTypeHandler);
  if (iVar5 < iVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x16b1,
                       "(typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity())"
                       ,
                       "typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity()"
                      );
    if (!bVar3) goto LAB_003d33d7;
    *puVar8 = 0;
  }
  uVar2 = local_80._16_8_;
  if (*(HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> **)(local_80._16_8_ + 0x70) ==
      (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) {
    pHVar13 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::New
                        (&this->tempAlloc->super_ArenaAllocator,8);
    *(HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> **)(uVar2 + 0x70) = pHVar13;
  }
  local_80._24_8_ = Sym::AsPropertySym((opnd->super_SymOpnd).m_sym);
  pAVar10 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                      (*(HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> **)(uVar2 + 0x70)
                       ,(((PropertySym *)local_80._24_8_)->m_stackSym->super_Sym).m_id);
  JITTypeHolderBase<void>::JITTypeHolderBase(&typeWithoutProperty,(JITType *)0x0);
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_58,(JITType *)0x0);
  finalType.t = (pAVar10->initialType).t;
  deadStoreUnavailableFinalType.t = (Type)0x0;
  bVar3 = JITTypeHolderBase<void>::operator==(&finalType,&deadStoreUnavailableFinalType.t);
  if (bVar3) {
LAB_003d3098:
    finalType = IR::PropertySymOpnd::GetType(opnd);
    bVar3 = JITTypeHolderBase<void>::operator==
                      (&finalType,&pAVar10->deadStoreUnavailableInitialType);
    if (bVar3) {
      local_58.t = (pAVar10->deadStoreUnavailableFinalType).t;
    }
    typeWithoutProperty = IR::PropertySymOpnd::GetType(opnd);
    (pAVar10->finalType).t = typeWithoutProperty.t;
  }
  else {
    local_98.t = (Type)IR::PropertySymOpnd::GetType(opnd);
    local_90.t = (pAVar10->initialType).t;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_98,&local_90);
    if (bVar3) goto LAB_003d3098;
    typeWithoutProperty.t = (pAVar10->finalType).t;
    local_58.t = (pAVar10->deadStoreUnavailableFinalType).t;
  }
  (pAVar10->initialType).t = local_48.t;
  SetTypeIDWithFinalType
            (this,((*(StackSym **)(local_80._24_8_ + 0x20))->super_Sym).m_id,(BasicBlock *)uVar2);
  uVar6 = Func::GetSourceContextId(this->func);
  uVar7 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ObjTypeSpecStorePhase,uVar6,uVar7);
  if (!bVar3) {
    if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 4) == 0) {
      deadStoreUnavailableFinalType.t = (Type)0x0;
      bVar3 = JITTypeHolderBase<void>::operator!=(&local_58,&deadStoreUnavailableFinalType.t);
      pJVar14 = &typeWithoutProperty;
      if (bVar3) {
        pJVar14 = &local_58;
      }
      finalType.t = pJVar14->t;
      bVar3 = IR::PropertySymOpnd::HasFinalType(opnd);
      if (bVar3) {
        deadStoreUnavailableFinalType.t = (opnd->finalType).t;
        bVar3 = JITTypeHolderBase<void>::operator!=(&deadStoreUnavailableFinalType,&finalType);
        if (bVar3) {
          deadStoreUnavailableFinalType.t = (opnd->finalType).t;
          pJVar11 = JITTypeHolderBase<void>::operator->(&deadStoreUnavailableFinalType);
          oldTypeHandler = (GlobOpt *)JITType::GetTypeHandler(pJVar11);
          pJVar11 = JITTypeHolderBase<void>::operator->(&finalType);
          pJVar12 = JITType::GetTypeHandler(pJVar11);
          bVar3 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining
                            ((JITTypeHandler *)oldTypeHandler,pJVar12);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            local_80._8_8_ = oldTypeHandler;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x16ff,
                               "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(oldFinalTypeHandler, checkFinalTypeHandler))"
                               ,"TypeHandlers should be compatible for transition.");
            if (!bVar3) goto LAB_003d33d7;
            *puVar8 = 0;
            oldTypeHandler = (GlobOpt *)local_80._8_8_;
          }
          iVar4 = JITTypeHandler::GetSlotCapacity((JITTypeHandler *)oldTypeHandler);
          iVar5 = JITTypeHandler::GetSlotCapacity(pJVar12);
          if (iVar5 < iVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1700,
                               "(oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity())"
                               ,
                               "oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity()"
                              );
            if (!bVar3) goto LAB_003d33d7;
            *puVar8 = 0;
          }
        }
      }
    }
    bVar3 = IR::PropertySymOpnd::IsBeingAdded(opnd);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1704,"(opnd->IsBeingAdded())","opnd->IsBeingAdded()");
      if (!bVar3) {
LAB_003d33d7:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    if (this->currentPrePassLoop == (Loop *)0x0) {
      IR::PropertySymOpnd::SetFinalType(opnd,typeWithoutProperty);
    }
    if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 10) == 2) {
      (pAVar10->finalType).t = (pAVar10->initialType).t;
    }
  }
  uVar6 = Func::GetSourceContextId(this->func);
  uVar7 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecStorePhase,uVar6,uVar7);
  if (bVar3) {
    Output::Print(L"ObjTypeSpecStore: ");
    IR::Instr::Dump(this->currentInstr);
    AddPropertyCacheBucket::Dump(pAVar10);
  }
  uVar2 = local_80._16_8_;
  if (((opnd->field_12).field_0.field_5.typeCheckSeqFlags & 2) != 0) {
    return;
  }
  (pAVar10->deadStoreUnavailableInitialType).t = (pAVar10->initialType).t;
  finalType.t = (Type)0x0;
  bVar3 = JITTypeHolderBase<void>::operator==(&pAVar10->deadStoreUnavailableFinalType,&finalType.t);
  if (bVar3) {
    (pAVar10->deadStoreUnavailableFinalType).t = (pAVar10->finalType).t;
  }
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_88,(JITType *)0x0);
  (pAVar10->initialType).t = local_88.t;
  this_00 = (BackwardPass *)local_80;
  JITTypeHolderBase<void>::JITTypeHolderBase((JITTypeHolderBase<void> *)this_00,(JITType *)0x0);
  (pAVar10->finalType).t = (Type)local_80._0_8_;
  ClearTypeIDWithFinalType
            (this_00,((*(StackSym **)(local_80._24_8_ + 0x20))->super_Sym).m_id,(BasicBlock *)uVar2)
  ;
  return;
}

Assistant:

void
BackwardPass::TrackAddPropertyTypes(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    // Do the work of objtypespec add-property opt even if it's disabled by PHASE option, so that we have
    // the dataflow info that can be inspected.

    Assert(this->tag == Js::DeadStorePhase);
    Assert(opnd->IsMono() || opnd->HasEquivalentTypeSet());

    JITTypeHolder typeWithProperty = opnd->IsMono() ? opnd->GetType() : opnd->GetFirstEquivalentType();
    JITTypeHolder typeWithoutProperty = opnd->HasInitialType() ? opnd->GetInitialType() : JITTypeHolder(nullptr);

    if (typeWithoutProperty == nullptr ||
        typeWithProperty == typeWithoutProperty ||
        (opnd->IsTypeChecked() && !opnd->IsInitialTypeChecked()))
    {
        if (!this->IsPrePass() && block->stackSymToFinalType != nullptr && !this->currentInstr->HasBailOutInfo())
        {
            PropertySym *propertySym = opnd->m_sym->AsPropertySym();
            AddPropertyCacheBucket *pBucket =
                block->stackSymToFinalType->Get(propertySym->m_stackSym->m_id);
            if (pBucket && pBucket->GetFinalType() != nullptr && pBucket->GetInitialType() != pBucket->GetFinalType())
            {
                opnd->SetFinalType(pBucket->GetFinalType());
            }
        }

        return;
    }

#if DBG
    Assert(typeWithProperty != nullptr);
    const JITTypeHandler * typeWithoutPropertyTypeHandler = typeWithoutProperty->GetTypeHandler();
    const JITTypeHandler * typeWithPropertyTypeHandler = typeWithProperty->GetTypeHandler();
    // TODO: OOP JIT, reenable assert
    //Assert(typeWithoutPropertyTypeHandler->GetPropertyCount() + 1 == typeWithPropertyTypeHandler->GetPropertyCount());
    AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(typeWithoutPropertyTypeHandler, typeWithPropertyTypeHandler),
        "TypeHandlers are not compatible for transition?");
    Assert(typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity());
#endif

    // If there's already a final type for this instance, record it on the operand.
    // If not, start tracking it.
    if (block->stackSymToFinalType == nullptr)
    {
        block->stackSymToFinalType = HashTable<AddPropertyCacheBucket>::New(this->tempAlloc, 8);
    }

    // Find or create the type-tracking record for this instance in this block.
    PropertySym *propertySym = opnd->m_sym->AsPropertySym();
    AddPropertyCacheBucket *pBucket =
        block->stackSymToFinalType->FindOrInsertNew(propertySym->m_stackSym->m_id);

    JITTypeHolder finalType(nullptr);
#if DBG
    JITTypeHolder deadStoreUnavailableFinalType(nullptr);
#endif
    if (pBucket->GetInitialType() == nullptr || opnd->GetType() != pBucket->GetInitialType())
    {
#if DBG
        if (opnd->GetType() == pBucket->deadStoreUnavailableInitialType)
        {
            deadStoreUnavailableFinalType = pBucket->deadStoreUnavailableFinalType;
        }
#endif
        // No info found, or the info was bad, so initialize it from this cache.
        finalType = opnd->GetType();
        pBucket->SetFinalType(finalType);
    }
    else
    {
        // Match: The type we push upward is now the typeWithoutProperty at this point,
        // and the final type is the one we've been tracking.
        finalType = pBucket->GetFinalType();
#if DBG
        deadStoreUnavailableFinalType = pBucket->deadStoreUnavailableFinalType;
#endif
    }

    pBucket->SetInitialType(typeWithoutProperty);
    this->SetTypeIDWithFinalType(propertySym->m_stackSym->m_id, block);

    if (!PHASE_OFF(Js::ObjTypeSpecStorePhase, this->func))
    {
#if DBG

        // We may regress in this case:
        // if (b)
        //      t1 = {};
        //      o = t1;
        //      o.x =
        // else
        //      t2 = {};
        //      o = t2;
        //      o.x =
        // o.y =
        //
        // Where the backward pass will propagate the final type in o.y to o.x, then globopt will copy prop t1 and t2 to o.x.
        // But not o.y (because of the merge).  Then, in the dead store pass, o.y's final type will not propagate to t1.x and t2.x
        // respectively, thus regression the final type.  However, in both cases, the types of t1 and t2 are dead anyways.
        //
        // if the type is dead, we don't care if we have regressed the type, as no one is depending on it to skip type check anyways
        if (!opnd->IsTypeDead())
        {
            // This is the type that would have been propagated if we didn't kill it because the type isn't available
            JITTypeHolder checkFinalType = deadStoreUnavailableFinalType != nullptr ? deadStoreUnavailableFinalType : finalType;
            if (opnd->HasFinalType() && opnd->GetFinalType() != checkFinalType)
            {
                // Final type discovery must be progressively better (unless we kill it in the deadstore pass
                // when the type is not available during the forward pass)
                const JITTypeHandler * oldFinalTypeHandler = opnd->GetFinalType()->GetTypeHandler();
                const JITTypeHandler * checkFinalTypeHandler = checkFinalType->GetTypeHandler();

                // TODO: OOP JIT, enable assert
                //Assert(oldFinalTypeHandler->GetPropertyCount() < checkFinalTypeHandler->GetPropertyCount());
                AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(oldFinalTypeHandler, checkFinalTypeHandler),
                    "TypeHandlers should be compatible for transition.");
                Assert(oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity());
            }
        }
#endif
        Assert(opnd->IsBeingAdded());
        if (!this->IsPrePass())
        {
            opnd->SetFinalType(finalType);
        }
        if (!opnd->IsTypeChecked())
        {
            // Transition from initial to final type will only happen at type check points.
            if (opnd->IsTypeAvailable())
            {
                pBucket->SetFinalType(pBucket->GetInitialType());
            }
        }
    }

#if DBG_DUMP
    if (PHASE_TRACE(Js::ObjTypeSpecStorePhase, this->func))
    {
        Output::Print(_u("ObjTypeSpecStore: "));
        this->currentInstr->Dump();
        pBucket->Dump();
    }
#endif

    // In the dead-store pass, we have forward information that tells us whether a "final type"
    // reached this point from an earlier store. If it didn't (i.e., it's not available here),
    // remove it from the backward map so that upstream stores will use the final type that is
    // live there. (This avoids unnecessary bailouts in cases where the final type is only live
    // on one branch of an "if", a case that the initial backward pass can't detect.)
    // An example:
    //  if (cond)
    //      o.x =
    //  o.y =

    if (!opnd->IsTypeAvailable())
    {
#if DBG
        pBucket->deadStoreUnavailableInitialType = pBucket->GetInitialType();
        if (pBucket->deadStoreUnavailableFinalType == nullptr)
        {
            pBucket->deadStoreUnavailableFinalType = pBucket->GetFinalType();
        }
        pBucket->SetInitialType(nullptr);
        pBucket->SetFinalType(nullptr);
#else
        block->stackSymToFinalType->Clear(propertySym->m_stackSym->m_id);
#endif
        this->ClearTypeIDWithFinalType(propertySym->m_stackSym->m_id, block);
    }
}